

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O0

string * __thiscall
helics::ForwardingTimeCoordinator::printTimeStatus_abi_cxx11_(ForwardingTimeCoordinator *this)

{
  string *in_RDI;
  undefined1 in_stack_00000150 [16];
  undefined1 in_stack_00000160 [16];
  double local_100;
  double local_f8;
  double local_f0;
  char *local_e8;
  undefined8 local_e0;
  double local_c8 [2];
  double local_b8 [2];
  undefined1 local_a8 [24];
  undefined8 local_90;
  double *local_88;
  char *local_80;
  undefined8 local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  char *local_58;
  undefined8 local_50;
  undefined1 *local_38;
  double local_30;
  double *local_28;
  double local_20;
  double *local_18;
  double *local_10;
  undefined8 *local_8;
  
  local_e8 = "{{\"time_next\":{}, \"Te\":{}, \"minDe\":{}}}";
  local_e0 = 0x27;
  local_f0 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x6338d8);
  local_f8 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x6338f2);
  local_100 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x63390c);
  local_58 = local_e8;
  local_50 = local_e0;
  local_60 = &local_f0;
  local_68 = &local_f8;
  local_70 = &local_100;
  local_80 = local_e8;
  local_78 = local_e0;
  local_20 = local_f0;
  local_18 = local_c8;
  local_c8[0] = local_f0;
  local_28 = local_b8;
  local_30 = local_f8;
  local_38 = local_a8;
  local_8 = &local_90;
  local_10 = local_c8;
  local_90 = 0xaaa;
  local_b8[0] = local_30;
  local_88 = local_10;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000160,(format_args)in_stack_00000150);
  return in_RDI;
}

Assistant:

std::string ForwardingTimeCoordinator::printTimeStatus() const
{
    return fmt::format(R"raw({{"time_next":{}, "Te":{}, "minDe":{}}})raw",
                       static_cast<double>(downstream.next),
                       static_cast<double>(downstream.Te),
                       static_cast<double>(downstream.minDe));
}